

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Periodicity.cpp
# Opt level: O0

vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> * __thiscall
amrex::Periodicity::shiftIntVect(Periodicity *this)

{
  int iVar1;
  bool bVar2;
  Periodicity *in_RSI;
  vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *in_RDI;
  int k;
  int j;
  int i_1;
  int i;
  int jmp [3];
  int per [3];
  vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *r;
  IntVect *this_00;
  vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *this_01;
  IntVect local_58;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c [4];
  int local_2c;
  int local_28;
  undefined1 local_21;
  int local_c;
  
  local_21 = 0;
  this_01 = in_RDI;
  std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::vector
            ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)0x1245742);
  memset(local_3c + 3,0,0xc);
  local_3c[0] = 1;
  local_3c[1] = 1;
  local_3c[2] = 1;
  for (local_40 = 0; local_40 < 3; local_40 = local_40 + 1) {
    bVar2 = isPeriodic(in_RSI,local_40);
    if (bVar2) {
      local_c = local_40;
      iVar1 = (in_RSI->period).vect[local_40];
      local_3c[local_40] = iVar1;
      local_3c[(long)local_40 + 3] = iVar1;
    }
  }
  for (local_44 = -local_3c[3]; local_44 <= local_3c[3]; local_44 = local_3c[0] + local_44) {
    for (local_48 = -local_2c; local_48 <= local_2c; local_48 = local_3c[1] + local_48) {
      for (local_4c = -local_28; local_4c <= local_28; local_4c = local_3c[2] + local_4c) {
        this_00 = &local_58;
        IntVect::IntVect(this_00,local_44,local_48,local_4c);
        std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::push_back(this_01,this_00);
      }
    }
  }
  return in_RDI;
}

Assistant:

std::vector<IntVect>
Periodicity::shiftIntVect () const
{
    std::vector<IntVect> r;

    int per[3] = {0,0,0};
    int jmp[3] = {1,1,1};

    for (int i = 0; i < AMREX_SPACEDIM; ++i) {
        if (isPeriodic(i)) {
            per[i] = jmp[i] = period[i];
        }
    }

    for (int i = -per[0]; i <= per[0]; i += jmp[0]) {
    for (int j = -per[1]; j <= per[1]; j += jmp[1]) {
    for (int k = -per[2]; k <= per[2]; k += jmp[2]) {
        r.push_back(IntVect(AMREX_D_DECL(i,j,k)));
    }
    }
    }

    return r;
}